

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::build(Heap<Gluco::Solver::VarOrderLt> *this,vec<int> *ns)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  piVar1 = (this->heap).data;
  if ((this->heap).sz < 1) {
    if (piVar1 == (int *)0x0) goto LAB_005cb108;
  }
  else {
    piVar2 = (this->indices).data;
    lVar3 = 0;
    do {
      piVar2[piVar1[lVar3]] = -1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->heap).sz);
  }
  (this->heap).sz = 0;
LAB_005cb108:
  if (0 < ns->sz) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      piVar1 = ns->data;
      (this->indices).data[*(int *)((long)piVar1 + lVar3)] = (int)lVar4;
      vec<int>::push(&this->heap,(int *)((long)piVar1 + lVar3));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 4;
    } while (lVar4 < ns->sz);
    uVar5 = (this->heap).sz;
    if (1 < (int)uVar5) {
      uVar5 = (uVar5 >> 1) + 1;
      do {
        percolateDown(this,uVar5 - 2);
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
  }
  return;
}

Assistant:

void build(vec<int>& ns) {
        int i;
        for (i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear();

        for (i = 0; i < ns.size(); i++){
            indices[ns[i]] = i;
            heap.push(ns[i]); }

        for (i = heap.size() / 2 - 1; i >= 0; i--)
            percolateDown(i);
    }